

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_wavtokenizer_dec::llm_build_wavtokenizer_dec
          (llm_build_wavtokenizer_dec *this,llama_model *model,llm_graph_params *params,
          ggml_cgraph *gf)

{
  ggml_tensor *pgVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ggml_tensor *act_scales;
  ggml_tensor *down_s;
  ggml_tensor *down;
  ggml_tensor *gate_s;
  pointer plVar7;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar8;
  llama_layer_convnext *layer_1;
  uint32_t il_1;
  ggml_tensor *kq;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *q;
  llama_layer_posnet *layer;
  uint32_t il;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  undefined8 in_stack_fffffffffffffd08;
  int iVar9;
  char *in_stack_fffffffffffffd10;
  llm_norm_type type;
  ggml_tensor *in_stack_fffffffffffffd18;
  ggml_tensor *in_stack_fffffffffffffd20;
  ggml_tensor *in_stack_fffffffffffffd28;
  llm_graph_context *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd68;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  llm_graph_context *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *down_b;
  llm_ffn_op_type type_op;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  uint local_6c;
  uint local_40;
  ggml_tensor *local_30;
  ggml_tensor *local_28;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd20,
             (llm_graph_params *)in_stack_fffffffffffffd18);
  pgVar1 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  uVar3 = *(undefined8 *)(in_RDI + 0xc0);
  uVar2 = ggml_transpose(uVar3,pgVar1);
  uVar3 = ggml_cont(uVar3,uVar2);
  uVar3 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),*(undefined8 *)(in_RSI + 0x19d0),uVar3,1);
  local_28 = (ggml_tensor *)
             ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,*(undefined8 *)(in_RSI + 0x19d8));
  local_40 = 0;
  do {
    if (*(uint *)(*(long *)(in_RDI + 8) + 0x40) <= local_40) {
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_transpose(uVar3,local_28);
      ggml_cont(uVar3,uVar2);
      pgVar1 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                          (int)in_stack_fffffffffffffd10);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_transpose(uVar3,pgVar1);
      pgVar1 = (ggml_tensor *)ggml_cont(uVar3,uVar2);
      local_30 = pgVar1;
      for (local_6c = 0; iVar9 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
          local_6c < *(uint *)(*(long *)(in_RDI + 8) + 0x48); local_6c = local_6c + 1) {
        pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (ulong)local_6c);
        uVar2 = ggml_conv_1d_dw_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->convnext).dw,local_30,1);
        act_scales = (ggml_tensor *)
                     ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar2,(pvVar4->convnext).dw_b);
        type_op = (llm_ffn_op_type)uVar2;
        down_b = *(ggml_tensor **)(in_RDI + 0xc0);
        down_s = (ggml_tensor *)ggml_transpose(down_b,act_scales);
        down = (ggml_tensor *)ggml_cont(down_b,down_s);
        gate_s = llm_graph_context::build_norm
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                            (int)in_stack_fffffffffffffd10);
        in_stack_fffffffffffffd18 = (pvVar4->convnext).pw2;
        in_stack_fffffffffffffd20 = (pvVar4->convnext).pw2_b;
        in_stack_fffffffffffffd30 = (llm_graph_context *)0x0;
        in_stack_fffffffffffffd28 = (ggml_tensor *)0x0;
        in_stack_fffffffffffffd10 = (char *)0x0;
        in_stack_fffffffffffffd08 = 0;
        in_stack_fffffffffffffdc0 =
             llm_graph_context::build_ffn
                       (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        in_stack_fffffffffffffdc0,gate_s,down,down_b,down_s,act_scales,type_op,
                        (llm_ffn_gate_type)pgVar1,(int)uVar3);
        in_stack_fffffffffffffdb0 =
             (llm_graph_context *)
             ggml_mul(*(undefined8 *)(in_RDI + 0xc0),in_stack_fffffffffffffdc0,
                      (pvVar4->convnext).gamma);
        in_stack_fffffffffffffda0 = *(ggml_tensor **)(in_RDI + 0xc0);
        in_stack_fffffffffffffda8 =
             (ggml_tensor *)ggml_transpose(in_stack_fffffffffffffda0,in_stack_fffffffffffffdb0);
        in_stack_fffffffffffffd98 =
             (ggml_tensor *)ggml_cont(in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
        in_stack_fffffffffffffd90 =
             (ggml_tensor *)
             ggml_add(*(undefined8 *)(in_RDI + 0xc0),in_stack_fffffffffffffd98,local_30);
        local_30 = in_stack_fffffffffffffd90;
      }
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_transpose(uVar3,local_30);
      ggml_cont(uVar3,uVar2);
      pgVar1 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                          (int)in_stack_fffffffffffffd10);
      pgVar1 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)pgVar1,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60);
      pgVar1 = (ggml_tensor *)
               ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar1,*(undefined8 *)(in_RSI + 0x19a0));
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd10,iVar9);
      plVar7 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                         ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                          0x50090f);
      plVar7->t_embd = pgVar1;
      ggml_build_forward_expand(in_RCX,pgVar1);
      return;
    }
    pvVar4 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (ulong)local_40);
    iVar9 = (int)in_stack_fffffffffffffd10;
    type = (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20);
    if (local_40 < 2) {
LAB_004ffbbf:
      pgVar1 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,type,iVar9);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_sigmoid(uVar3,pgVar1);
      uVar3 = ggml_mul(uVar3,uVar2,pgVar1);
      uVar3 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->posnet).conv1,uVar3,1);
      ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,(pvVar4->posnet).conv1_b);
      pgVar1 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                          (int)in_stack_fffffffffffffd10);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_sigmoid(uVar3,pgVar1);
      uVar3 = ggml_mul(uVar3,uVar2,pgVar1);
      uVar3 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->posnet).conv2,uVar3,1);
      uVar3 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,(pvVar4->posnet).conv2_b);
      local_28 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,local_28);
    }
    else if (local_40 == 2) {
      pgVar1 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,type,iVar9);
      uVar3 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->posnet).attn_q,pgVar1,1);
      uVar2 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->posnet).attn_k,pgVar1,1);
      uVar5 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->posnet).attn_v,pgVar1,1);
      uVar6 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,(pvVar4->posnet).attn_q_b);
      uVar2 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar2,(pvVar4->posnet).attn_k_b);
      uVar5 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar5,(pvVar4->posnet).attn_v_b);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar6 = ggml_transpose(uVar3,uVar6);
      uVar6 = ggml_cont(uVar3,uVar6);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_transpose(uVar3,uVar2);
      uVar3 = ggml_cont(uVar3,uVar2);
      uVar2 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),uVar3,uVar6);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      fVar8 = sqrtf((float)*(uint *)(*(long *)(in_RDI + 8) + 0x3c));
      uVar3 = ggml_soft_max_ext(1.0 / fVar8,0,uVar3,uVar2,0);
      uVar3 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),uVar3,uVar5);
      uVar3 = ggml_conv_1d_ph(*(undefined8 *)(in_RDI + 0xc0),(pvVar4->posnet).attn_o,uVar3,1);
      uVar3 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,(pvVar4->posnet).attn_o_b);
      local_28 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar3,local_28);
    }
    else {
      if (local_40 - 3 < 2) goto LAB_004ffbbf;
      if (local_40 != 5) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
                   ,0x3061,"unknown posnet layer");
      }
      local_28 = llm_graph_context::build_norm
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,type,iVar9);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

llm_build_wavtokenizer_dec(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, inpL));

        cur = ggml_conv_1d_ph(ctx0, model.conv1d, cur, 1, 1);
        cur = ggml_add(ctx0, cur, model.conv1d_b);

        // posnet
        for (uint32_t il = 0; il < hparams.posnet.n_layer; ++il) {
            const auto & layer = model.layers[il].posnet;

            inpL = cur;

            switch (il) {
                case 0:
                case 1:
                case 3:
                case 4:
                    {
                        cur = build_norm(cur,
                                layer.norm1,
                                layer.norm1_b,
                                LLM_NORM_GROUP, 0);

                        cur = ggml_mul(ctx0, ggml_sigmoid(ctx0, cur), cur);

                        cur = ggml_conv_1d_ph(ctx0, layer.conv1, cur, 1, 1);
                        cur = ggml_add(ctx0, cur, layer.conv1_b);

                        cur = build_norm(cur,
                                layer.norm2,
                                layer.norm2_b,
                                LLM_NORM_GROUP, 0);

                        cur = ggml_mul(ctx0, ggml_sigmoid(ctx0, cur), cur);

                        cur = ggml_conv_1d_ph(ctx0, layer.conv2, cur, 1, 1);
                        cur = ggml_add(ctx0, cur, layer.conv2_b);

                        cur = ggml_add(ctx0, cur, inpL);
                    } break;
                case 2:
                    {
                        cur = build_norm(cur,
                                layer.attn_norm,
                                layer.attn_norm_b,
                                LLM_NORM_GROUP, 0);

                        ggml_tensor * q;
                        ggml_tensor * k;
                        ggml_tensor * v;

                        q = ggml_conv_1d_ph(ctx0, layer.attn_q, cur, 1, 1);
                        k = ggml_conv_1d_ph(ctx0, layer.attn_k, cur, 1, 1);
                        v = ggml_conv_1d_ph(ctx0, layer.attn_v, cur, 1, 1);

                        q = ggml_add(ctx0, q, layer.attn_q_b);
                        k = ggml_add(ctx0, k, layer.attn_k_b);
                        v = ggml_add(ctx0, v, layer.attn_v_b);

                        q = ggml_cont(ctx0, ggml_transpose(ctx0, q));
                        k = ggml_cont(ctx0, ggml_transpose(ctx0, k));

                        ggml_tensor * kq = ggml_mul_mat(ctx0, k, q);

                        kq = ggml_soft_max_ext(ctx0, kq, nullptr, 1.0f/sqrtf(float(hparams.posnet.n_embd)), 0.0f);

                        cur = ggml_mul_mat(ctx0, kq, v);

                        cur = ggml_conv_1d_ph(ctx0, layer.attn_o, cur, 1, 1);
                        cur = ggml_add(ctx0, cur, layer.attn_o_b);

                        cur = ggml_add(ctx0, cur, inpL);
                    } break;
                case 5:
                    {
                        cur = build_norm(cur,
                                layer.norm,
                                layer.norm_b,
                                LLM_NORM_GROUP, 0);
                    } break;
                default: GGML_ABORT("unknown posnet layer");
            };
        }

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

        cur = build_norm(cur,
                model.tok_norm,
                model.tok_norm_b,
                LLM_NORM, -1);

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

        inpL = cur;

        // convnext
        for (uint32_t il = 0; il < hparams.convnext.n_layer; ++il) {
            const auto & layer = model.layers[il].convnext;

            cur = inpL;

            cur = ggml_conv_1d_dw_ph(ctx0, layer.dw, cur, 1, 1);
            cur = ggml_add(ctx0, cur, layer.dw_b);

            cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

            cur = build_norm(cur,
                    layer.norm,
                    layer.norm_b,
                    LLM_NORM, -1);

            cur = build_ffn(cur,
                    layer.pw1, layer.pw1_b, NULL,
                    NULL,      NULL,        NULL,
                    layer.pw2, layer.pw2_b, NULL,
                    NULL,
                    LLM_FFN_GELU, LLM_FFN_SEQ, il);

            cur = ggml_mul(ctx0, cur, layer.gamma);

            cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

            inpL = ggml_add(ctx0, cur, inpL);
        }

        cur = inpL;

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

        cur = build_norm(cur,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cur = ggml_add(ctx0, cur, model.output_b);

        cb(cur, "result_embd", -1);
        res->t_embd = cur;

        ggml_build_forward_expand(gf, cur);
    }